

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall pybind11::error_already_set::error_already_set(error_already_set *this)

{
  long *local_48 [2];
  long local_38 [2];
  
  detail::error_string_abi_cxx11_();
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  *(undefined ***)this = &PTR__error_already_set_0013ab28;
  (this->m_type).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_value).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_trace).super_handle.m_ptr = (PyObject *)0x0;
  PyErr_Fetch(&this->m_type,&this->m_value,&this->m_trace);
  return;
}

Assistant:

error_already_set() : std::runtime_error(detail::error_string()) {
        PyErr_Fetch(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
    }